

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O2

void __thiscall t_c_glib_generator::init_generator(t_c_glib_generator *this)

{
  string *__rhs;
  ofstream_with_content_based_conditional_update *this_00;
  ofstream_with_content_based_conditional_update *this_01;
  pointer pptVar1;
  pointer pbVar2;
  int iVar3;
  int *piVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  char *__rhs_00;
  int __oflag;
  int __oflag_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c_include;
  pointer pptVar6;
  pointer pbVar7;
  t_program *ptVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  string program_name_u;
  string include_nspace_prefix;
  string f_types_impl_name;
  string program_name_lc;
  string program_name_uc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string f_types_name;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&program_name_u,this);
  iVar3 = mkdir(program_name_u._M_dataplus._M_p,0x1ff);
  std::__cxx11::string::~string((string *)&program_name_u);
  if (iVar3 == -1) {
    piVar4 = __errno_location();
    if (*piVar4 != 0x11) {
      __return_storage_ptr__ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
      (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])
                (&program_name_lc,this);
      std::__cxx11::string::string
                ((string *)&program_name_uc,program_name_lc._M_dataplus._M_p,
                 (allocator *)&f_types_name);
      std::operator+(&program_name_u,&program_name_uc,": ");
      __rhs_00 = strerror(*piVar4);
      std::operator+(__return_storage_ptr__,&program_name_u,__rhs_00);
      __cxa_throw(__return_storage_ptr__,&std::__cxx11::string::typeinfo,
                  std::__cxx11::string::~string);
    }
  }
  std::__cxx11::string::string
            ((string *)&local_50,
             (string *)&(this->super_t_oop_generator).super_t_generator.program_name_);
  initial_caps_to_underscores(&program_name_u,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string((string *)&local_d0,(string *)&program_name_u);
  to_upper_case(&program_name_uc,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string((string *)&local_f0,(string *)&program_name_u);
  to_lower_case(&program_name_lc,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])
            (&include_nspace_prefix,this);
  __rhs = &this->nspace_lc;
  std::operator+(&local_210,&include_nspace_prefix,__rhs);
  std::operator+(&f_types_impl_name,&local_210,&program_name_lc);
  std::operator+(&f_types_name,&f_types_impl_name,"_types.h");
  std::__cxx11::string::~string((string *)&f_types_impl_name);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&include_nspace_prefix);
  std::__cxx11::string::string
            ((string *)&f_types_impl_name,f_types_name._M_dataplus._M_p,(allocator *)&local_210);
  this_00 = &this->f_types_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_00,(char *)&f_types_impl_name,__oflag);
  std::__cxx11::string::~string((string *)&f_types_impl_name);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1b])(&local_130,this);
  std::operator+(&include_nspace_prefix,&local_130,__rhs);
  std::operator+(&local_210,&include_nspace_prefix,&program_name_lc);
  std::operator+(&f_types_impl_name,&local_210,"_types.c");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&include_nspace_prefix);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::string
            ((string *)&local_210,f_types_impl_name._M_dataplus._M_p,
             (allocator *)&include_nspace_prefix);
  this_01 = &this->f_types_impl_;
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            (this_01,(char *)&local_210,__oflag_00);
  std::__cxx11::string::~string((string *)&local_210);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_210,this);
  std::operator<<((ostream *)this_00,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  (*(this->super_t_oop_generator).super_t_generator._vptr_t_generator[0x1c])(&local_210,this);
  std::operator<<((ostream *)this_01,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  poVar5 = std::operator<<((ostream *)this_00,"#ifndef ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,(string *)&program_name_uc);
  poVar5 = std::operator<<(poVar5,"_TYPES_H");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#define ");
  poVar5 = std::operator<<(poVar5,(string *)&this->nspace_uc);
  poVar5 = std::operator<<(poVar5,(string *)&program_name_uc);
  poVar5 = std::operator<<(poVar5,"_TYPES_H");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)this_00,"/* base includes */");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <glib-object.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/c_glib/thrift_struct.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/c_glib/protocol/thrift_protocol.h>");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  ptVar8 = (this->super_t_oop_generator).super_t_generator.program_;
  if ((ptVar8->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (ptVar8->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    poVar5 = std::operator<<((ostream *)this_00,"/* other thrift includes */");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    pptVar1 = (ptVar8->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    for (pptVar6 = (ptVar8->includes_).super__Vector_base<t_program_*,_std::allocator<t_program_*>_>
                   ._M_impl.super__Vector_impl_data._M_start; pptVar6 != pptVar1;
        pptVar6 = pptVar6 + 1) {
      ptVar8 = *pptVar6;
      std::__cxx11::string::string((string *)&local_b0,"c_glib",(allocator *)&include_nspace_prefix)
      ;
      t_program::get_namespace(&local_210,ptVar8,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      if (local_210._M_string_length == 0) {
        std::__cxx11::string::string((string *)&include_nspace_prefix,"",(allocator *)&local_130);
      }
      else {
        std::__cxx11::string::string((string *)&local_70,(string *)&local_210);
        initial_caps_to_underscores(&local_130,&local_70);
        std::operator+(&include_nspace_prefix,&local_130,"_");
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_70);
      }
      poVar5 = std::operator<<((ostream *)this_00,"#include \"");
      poVar5 = std::operator<<(poVar5,(string *)&include_nspace_prefix);
      std::__cxx11::string::string((string *)&local_90,(string *)&ptVar8->name_);
      initial_caps_to_underscores(&local_130,&local_90);
      poVar5 = std::operator<<(poVar5,(string *)&local_130);
      poVar5 = std::operator<<(poVar5,"_types.h\"");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&include_nspace_prefix);
      std::__cxx11::string::~string((string *)&local_210);
    }
    std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
    ptVar8 = (this->super_t_oop_generator).super_t_generator.program_;
  }
  poVar5 = std::operator<<((ostream *)this_00,"/* custom thrift includes */");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  pbVar2 = (ptVar8->c_includes_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar7 = (ptVar8->c_includes_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar7 != pbVar2; pbVar7 = pbVar7 + 1) {
    if (*(pbVar7->_M_dataplus)._M_p == '<') {
      poVar5 = std::operator<<((ostream *)this_00,"#include ");
      poVar5 = std::operator<<(poVar5,(string *)pbVar7);
    }
    else {
      poVar5 = std::operator<<((ostream *)this_00,"#include \"");
      poVar5 = std::operator<<(poVar5,(string *)pbVar7);
      poVar5 = std::operator<<(poVar5,"\"");
    }
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  }
  std::operator<<((ostream *)this_00,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)this_01,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <math.h>");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)this_01,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include \"");
  poVar5 = std::operator<<(poVar5,(string *)__rhs);
  poVar5 = std::operator<<(poVar5,(string *)&program_name_u);
  poVar5 = std::operator<<(poVar5,"_types.h\"");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"#include <thrift/c_glib/thrift.h>");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  poVar5 = std::operator<<((ostream *)this_00,"/* begin types */");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&f_types_impl_name);
  std::__cxx11::string::~string((string *)&f_types_name);
  std::__cxx11::string::~string((string *)&program_name_lc);
  std::__cxx11::string::~string((string *)&program_name_uc);
  std::__cxx11::string::~string((string *)&program_name_u);
  return;
}

Assistant:

void t_c_glib_generator::init_generator() {
  /* create output directory */
  MKDIR(get_out_dir().c_str());

  string program_name_u = initial_caps_to_underscores(program_name_);
  string program_name_uc = to_upper_case(program_name_u);
  string program_name_lc = to_lower_case(program_name_u);

  /* create output files */
  string f_types_name = get_out_dir() + this->nspace_lc + program_name_lc + "_types.h";
  f_types_.open(f_types_name.c_str());
  string f_types_impl_name = get_out_dir() + this->nspace_lc + program_name_lc + "_types.c";
  f_types_impl_.open(f_types_impl_name.c_str());

  /* add thrift boilerplate headers */
  f_types_ << autogen_comment();
  f_types_impl_ << autogen_comment();

  /* include inclusion guard */
  f_types_ << "#ifndef " << this->nspace_uc << program_name_uc << "_TYPES_H" << endl << "#define "
           << this->nspace_uc << program_name_uc << "_TYPES_H" << endl << endl;

  /* include base types */
  f_types_ << "/* base includes */" << endl << "#include <glib-object.h>" << endl
           << "#include <thrift/c_glib/thrift_struct.h>" << endl
           << "#include <thrift/c_glib/protocol/thrift_protocol.h>" << endl;

  /* include other thrift includes */
  const vector<t_program*>& includes = program_->get_includes();
  if (!includes.empty()) {
    f_types_ << "/* other thrift includes */" << endl;

    for (auto include : includes) {
      const std::string& include_nspace = include->get_namespace("c_glib");
      std::string include_nspace_prefix =
        include_nspace.empty() ? "" : initial_caps_to_underscores(include_nspace) + "_";

      f_types_ << "#include \"" << include_nspace_prefix
               << initial_caps_to_underscores(include->get_name()) << "_types.h\"" << endl;
    }
    f_types_ << endl;
  }

  /* include custom headers */
  const vector<string>& c_includes = program_->get_c_includes();
  f_types_ << "/* custom thrift includes */" << endl;
  for (const auto & c_include : c_includes) {
    if (c_include[0] == '<') {
      f_types_ << "#include " << c_include << endl;
    } else {
      f_types_ << "#include \"" << c_include << "\"" << endl;
    }
  }
  f_types_ << endl;

  /* include math.h (for "INFINITY") in the implementation file, in case we
     encounter a struct with a member of type double */
  f_types_impl_ << endl << "#include <math.h>" << endl;

  // include the types file
  f_types_impl_ << endl << "#include \"" << this->nspace_lc << program_name_u << "_types.h\""
                << endl << "#include <thrift/c_glib/thrift.h>" << endl << endl;

  f_types_ << "/* begin types */" << endl << endl;
}